

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv2022.cpp
# Opt level: O1

void UConverter_fromUnicode_ISO_2022_JP_OFFSETS_LOGIC
               (UConverterFromUnicodeArgs *args,UErrorCode *err)

{
  byte bVar1;
  char cVar2;
  UChar UVar3;
  UChar *pUVar4;
  byte bVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  byte bVar11;
  byte bVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  UChar *pUVar18;
  uint uVar19;
  char *pcVar20;
  void *pvVar21;
  UBool useFallback;
  ulong uVar22;
  UConverter *cnv;
  uint uVar23;
  int iVar24;
  ulong uVar25;
  bool bVar26;
  uint local_e0;
  uint32_t value;
  undefined4 uStack_d4;
  char buffer [8];
  int32_t *offsets;
  uint local_bc;
  UErrorCode *local_b8;
  UConverterFromUnicodeArgs *local_b0;
  char *local_a8;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  char *local_90;
  void *local_88;
  UConverter *local_80;
  UChar *local_78;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  byte bStack_5b;
  int8_t choices [10];
  
  cnv = args->converter;
  pUVar18 = args->source;
  pcVar20 = args->target;
  local_90 = args->targetLimit;
  local_78 = args->sourceLimit;
  offsets = args->offsets;
  pvVar21 = cnv->extraInfo;
  uVar23 = cnv->fromUChar32;
  local_e0 = 0;
  uVar22 = 0;
  local_b8 = err;
  local_b0 = args;
  local_88 = pvVar21;
  local_80 = cnv;
  if (uVar23 != 0 && pcVar20 < local_90) goto LAB_0030cc41;
LAB_0030cc09:
  do {
    if (local_78 <= pUVar18) goto LAB_0030d616;
    if (local_90 <= pcVar20) {
      *err = U_BUFFER_OVERFLOW_ERROR;
      goto LAB_0030d616;
    }
    UVar3 = *pUVar18;
    uVar23 = (uint)(ushort)UVar3;
    pUVar18 = pUVar18 + 1;
    if ((uVar23 & 0xf800) == 0xd800) {
      if (((ushort)UVar3 >> 10 & 1) != 0) goto LAB_0030d601;
LAB_0030cc41:
      if (pUVar18 < local_78) {
        UVar3 = *pUVar18;
        uVar6 = UVar3 & 0xfc00;
        if (uVar6 == 0xdc00) {
          pUVar18 = pUVar18 + 1;
          iVar24 = uVar23 * 0x400;
          uVar23 = 0;
          uVar7 = (uint)(ushort)UVar3 + iVar24 + 0xfca02400;
        }
        else {
          *err = U_ILLEGAL_CHAR_FOUND;
          uVar7 = uVar23;
        }
        cnv->fromUChar32 = uVar23;
        uVar23 = uVar7;
        if (uVar6 == 0xdc00) goto LAB_0030cc90;
      }
      else {
LAB_0030d608:
        cnv->fromUChar32 = uVar23;
      }
      goto LAB_0030d616;
    }
LAB_0030cc90:
    if (((int)uVar23 < 0x20) && ((0x800c000U >> (uVar23 & 0x1f) & 1) != 0)) {
LAB_0030d601:
      *err = U_ILLEGAL_CHAR_FOUND;
      goto LAB_0030d608;
    }
    if ((int)uVar22 == 0) {
      uVar6 = jpCharsetMasks[*(uint *)((long)pvVar21 + 0x6c)];
      bVar26 = *(uint *)((long)pvVar21 + 0x6c) - 3 < 2;
      if (bVar26) {
        choices[0] = '\b';
      }
      uVar13 = (uint)bVar26;
      bVar11 = *(byte *)((long)pvVar21 + 0x62);
      uVar25 = (ulong)uVar13;
      choices[uVar25] = bVar11;
      uVar22 = uVar25 + 1;
      uVar7 = (uint)uVar6 & ~(1 << (bVar11 & 0x1f)) & 0xfeff;
      bVar11 = *(byte *)((long)pvVar21 + 100);
      if (bVar11 != 0) {
        choices[uVar25 + 1] = bVar11;
        uVar7 = uVar7 & ~(1 << (bVar11 & 0x1f));
        uVar22 = (ulong)(uVar13 | 2);
      }
      lVar17 = 0;
      do {
        bVar11 = (byte)*(uint *)((long)jpCharsetPref + lVar17);
        if ((uVar7 >> (*(uint *)((long)jpCharsetPref + lVar17) & 0x1f) & 1) != 0) {
          iVar24 = (int)uVar22;
          uVar22 = (ulong)(iVar24 + 1);
          choices[iVar24] = bVar11;
          uVar7 = uVar7 & ~(1 << (bVar11 & 0x1f));
        }
        lVar17 = lVar17 + 4;
      } while (lVar17 != 0x24);
    }
    local_a8 = pcVar20;
    if ((int)uVar22 < 1) {
      bVar11 = 0;
      bVar5 = 0;
      uVar7 = 0;
    }
    else {
      useFallback = cnv->useFallback;
      lVar17 = (long)((int)uVar23 >> 10);
      local_bc = uVar23 & 0xf;
      local_94 = 0x10000 << (sbyte)local_bc;
      uVar19 = uVar23 >> 4 & 0x3f;
      local_9c = uVar23 - 0xe000;
      local_a0 = uVar23 - 0xf0000;
      uVar13 = uVar23 - 0xff61;
      uVar7 = 0xfffe;
      if (uVar23 == 0x203e) {
        uVar7 = 0x7e;
      }
      local_60 = 0x5c;
      if (uVar23 != 0xa5) {
        local_60 = uVar7;
      }
      local_6c = uVar23 - 0xfec0;
      local_70 = uVar23 - 0xff40;
      local_64 = uVar23 - 0xa0;
      local_68 = uVar23 - 0x80;
      uVar25 = 1;
      uVar7 = 0;
      bVar5 = 0;
      bVar11 = 0;
      local_98 = uVar19;
      do {
        bVar1 = choices[uVar25 - 1];
        lVar10 = (long)(char)bVar1;
        switch(bVar1) {
        case 0:
          if ((int)uVar23 < 0x80) {
            bVar5 = 0;
            local_e0 = uVar23;
LAB_0030cf9a:
            uVar7 = 1;
            bVar11 = bVar1;
          }
          break;
        case 1:
          if (local_64 < 0x60) {
            bVar5 = 2;
            local_e0 = local_68;
            goto LAB_0030cf9a;
          }
          break;
        case 2:
          lVar10 = *(long *)((long)pvVar21 + lVar10 * 8);
          if ((0xffff < (int)uVar23) && ((*(byte *)(lVar10 + 0xfd) & 1) == 0)) goto LAB_0030d1c2;
          uVar6 = *(ushort *)
                   (*(long *)(lVar10 + 0xe8) +
                   (ulong)(*(ushort *)
                            (*(long *)(lVar10 + 0x58) +
                            (ulong)(*(ushort *)(*(long *)(lVar10 + 0x58) + lVar17 * 2) + uVar19) * 2
                            ) + local_bc) * 2);
          _value = (char *)CONCAT44(uStack_d4,(uint)(byte)uVar6);
          if (uVar6 < 0xf00) {
            if (useFallback == '\0') {
              if (uVar6 < 0xc00) goto LAB_0030d1c2;
            }
            else if (uVar6 < 0x800) {
LAB_0030d1c2:
              uVar8 = 0;
              bVar26 = true;
              bVar12 = 1;
              goto LAB_0030d1c8;
            }
            uVar8 = 0xffffffff;
            bVar26 = false;
            bVar12 = 0;
          }
          else {
            uVar8 = 1;
            bVar12 = 1;
            bVar26 = false;
          }
LAB_0030d1c8:
          if ((!bVar26) && ((bool)(value - 0xa0 < 0x60 & (bVar12 | uVar7 == 0)))) {
            local_e0 = value - 0x80;
            bVar5 = 2;
LAB_0030d378:
            useFallback = '\0';
            uVar7 = uVar8;
            bVar11 = bVar1;
          }
          break;
        case 3:
          uVar8 = local_60;
          if ((uVar23 < 0x80) && ((uVar23 == 0x7e || (uVar8 = uVar23, uVar23 == 0x5c)))) {
            uVar8 = 0xfffe;
          }
          _value = (char *)CONCAT44(uStack_d4,uVar8);
          if (uVar8 < 0x80) {
            uVar7 = 1;
            local_e0 = uVar8;
LAB_0030cfe1:
            useFallback = '\0';
            bVar5 = 0;
            bVar11 = bVar1;
          }
          break;
        case 4:
          lVar10 = *(long *)((long)pvVar21 + lVar10 * 8);
          if (((int)uVar23 < 0x10000) || ((*(byte *)(lVar10 + 0xfd) & 1) != 0)) {
            uVar8 = *(uint *)(*(long *)(lVar10 + 0x58) +
                             (ulong)(*(ushort *)(*(long *)(lVar10 + 0x58) + lVar17 * 2) + uVar19) *
                             4);
            uVar6 = *(ushort *)
                     (*(long *)(lVar10 + 0xe8) + (ulong)((uVar8 & 0xffff) * 0x10 + local_bc) * 2);
            uVar14 = (uint)uVar6;
            if ((local_94 & uVar8) == 0) {
              if ((((useFallback == '\0') && (0x18ff < local_9c)) && (0x1ffff < local_a0)) ||
                 (uVar6 == 0)) goto LAB_0030d013;
              uVar8 = uVar6 < 0x100 | 0xfffffffe;
              _value = (char *)CONCAT44(uStack_d4,uVar14);
            }
            else {
              uVar8 = 2 - (uVar14 < 0x100);
              _value = (char *)CONCAT44(uStack_d4,uVar14);
            }
          }
          else {
LAB_0030d013:
            if (*(int32_t **)(lVar10 + 0x120) == (int32_t *)0x0) {
              uVar8 = 0;
            }
            else {
              uVar8 = ucnv_extSimpleMatchFromU_63
                                (*(int32_t **)(lVar10 + 0x120),uVar23,&value,useFallback);
              pvVar21 = local_88;
              uVar19 = local_98;
            }
          }
          if ((uVar8 == 2) || ((uVar8 == 0xfffffffe && (uVar7 == 0)))) {
            uVar14 = 0;
            if (value < 0xeffd) {
              iVar24 = ((uint)((value & 0xff00) < 0x9f01) * 0x4000 + (value & 0xff00)) * 2;
              uVar14 = iVar24 - 0x16000;
              if ((value & 0xff) < 0x9f) {
                uVar14 = iVar24 - 0x16100;
                uVar16 = value & 0xff;
                if (uVar16 < 0x7f) {
                  uVar16 = uVar16 - 0x1f;
                }
                else {
                  uVar16 = uVar16 - 0x20;
                }
              }
              else {
                uVar16 = (value & 0xff) - 0x7e;
              }
              uVar14 = uVar14 | uVar16;
            }
            _value = (char *)CONCAT44(uStack_d4,uVar14);
            if (uVar14 != 0) goto LAB_0030d369;
          }
          else if (((uVar7 == 0) && (useFallback != '\0')) && (uVar7 = 0, uVar13 < 0x3f)) {
            uVar7 = 0xfffffffe;
            local_e0 = (uint)hwkana_fb[uVar13];
            goto LAB_0030cfe1;
          }
          break;
        default:
          lVar10 = *(long *)((long)pvVar21 + lVar10 * 8);
          if (((int)uVar23 < 0x10000) || ((*(byte *)(lVar10 + 0xfd) & 1) != 0)) {
            uVar8 = *(uint *)(*(long *)(lVar10 + 0x58) +
                             (ulong)(*(ushort *)(*(long *)(lVar10 + 0x58) + lVar17 * 2) + uVar19) *
                             4);
            uVar6 = *(ushort *)
                     (*(long *)(lVar10 + 0xe8) + (ulong)((uVar8 & 0xffff) * 0x10 + local_bc) * 2);
            if ((local_94 & uVar8) == 0) {
              if ((((useFallback == '\0') && (0x18ff < local_9c)) && (0x1ffff < local_a0)) ||
                 (uVar6 == 0)) goto LAB_0030cf2f;
              uVar8 = uVar6 < 0x100 | 0xfffffffe;
            }
            else {
              uVar8 = 2 - (uVar6 < 0x100);
            }
            _value = (char *)CONCAT44(uStack_d4,(uint)uVar6);
          }
          else {
LAB_0030cf2f:
            if (*(int32_t **)(lVar10 + 0x120) == (int32_t *)0x0) {
              uVar8 = 0;
            }
            else {
              uVar8 = ucnv_extSimpleMatchFromU_63
                                (*(int32_t **)(lVar10 + 0x120),uVar23,&value,useFallback);
              pvVar21 = local_88;
              uVar19 = local_98;
            }
          }
          if ((uVar8 == 2) || ((uVar8 == 0xfffffffe && (uVar7 == 0)))) {
            if (bVar1 == 7) {
              iVar24 = 0;
              if (((value + 0x5e5f & 0xfffe) < 0x5d5e) &&
                 (iVar24 = value - 0x8080, 0x5d < (value + 0x5f & 0xfe))) {
                iVar24 = 0;
              }
              _value = (char *)CONCAT44(uStack_d4,iVar24);
              if (iVar24 == 0) break;
            }
            local_e0 = value;
            uVar14 = local_e0;
LAB_0030d369:
            local_e0 = uVar14;
            bVar5 = 0;
            goto LAB_0030d378;
          }
          break;
        case 8:
          if (uVar13 < 0x3f) {
            if (*(int *)((long)pvVar21 + 0x6c) == 4) {
              bVar11 = *(byte *)((long)pvVar21 + 0x62);
              if ((bVar11 & 0xfc) == 4) {
                bVar11 = 3;
              }
              uVar7 = 1;
              bVar5 = 0;
              local_e0 = local_6c;
            }
            else if (*(int *)((long)pvVar21 + 0x6c) == 3) {
              *(byte *)((long)pvVar21 + 99) = bVar1;
              bVar5 = 1;
              local_e0 = local_70;
              goto LAB_0030cf9a;
            }
          }
        }
      } while ((uVar25 < uVar22) && (uVar25 = uVar25 + 1, (int)uVar7 < 1));
    }
    if (uVar7 == 0) {
      *local_b8 = U_INVALID_CHAR_FOUND;
      local_80->fromUChar32 = uVar23;
      pcVar20 = local_a8;
      cnv = local_80;
      err = local_b8;
      goto LAB_0030d616;
    }
    uVar13 = -uVar7;
    if (0 < (int)uVar7) {
      uVar13 = uVar7;
    }
    bVar26 = *(char *)((long)pvVar21 + 0x66) == '\x01';
    if (bVar26 && bVar5 == 0) {
      buffer[0] = '\x0f';
      *(undefined1 *)((long)pvVar21 + 0x66) = 0;
    }
    bVar26 = bVar26 && bVar5 == 0;
    uVar25 = (ulong)bVar26;
    if (bVar11 != *(byte *)((long)pvVar21 + (ulong)bVar5 + 0x62)) {
      cVar2 = "\x03\x03\x03\x03\x03\x04\x03\x04\x03"[(char)bVar11];
      memcpy(buffer + uVar25,escSeqChars + (char)bVar11,(long)cVar2);
      uVar25 = (ulong)((uint)bVar26 + (int)cVar2);
      *(byte *)((long)local_88 + (ulong)bVar5 + 0x62) = bVar11;
      uVar22 = 0;
      pvVar21 = local_88;
    }
    cnv = local_80;
    iVar9 = (int)uVar25;
    iVar24 = iVar9;
    if (bVar5 != *(byte *)((long)pvVar21 + 0x66)) {
      iVar24 = iVar9 + 1;
      if (bVar5 == 1) {
        buffer[iVar9] = '\x0e';
        *(undefined1 *)((long)pvVar21 + 0x66) = 1;
      }
      else {
        buffer[iVar9] = '\x1b';
        iVar24 = iVar9 + 2;
        buffer[(long)iVar9 + 1] = 'N';
      }
    }
    iVar15 = 1;
    iVar9 = iVar24;
    if (uVar13 != 1) {
      iVar9 = iVar24 + 1;
      buffer[iVar24] = (char)(local_e0 >> 8);
      iVar15 = 2;
    }
    iVar24 = iVar24 + iVar15;
    buffer[iVar9] = (char)local_e0;
    err = local_b8;
    if ((uVar23 == 0xd) || (uVar23 == 10)) {
      *(undefined1 *)((long)pvVar21 + 100) = 0;
      uVar22 = 0;
    }
    if (iVar24 == 2) {
      pcVar20 = local_a8 + 2;
      if (pcVar20 <= local_90) {
        *local_a8 = buffer[0];
        local_a8[1] = buffer[1];
        if (offsets != (int32_t *)0x0) {
          iVar24 = -1;
          if (0xffff < uVar23) {
            iVar24 = -2;
          }
          iVar24 = (int)((ulong)((long)pUVar18 - (long)local_b0->source) >> 1) + iVar24;
          *offsets = iVar24;
          offsets[1] = iVar24;
          offsets = offsets + 2;
        }
        goto LAB_0030cc09;
      }
    }
    else if (iVar24 == 1) {
      *local_a8 = buffer[0];
      pcVar20 = local_a8 + 1;
      if (offsets != (int32_t *)0x0) {
        *offsets = (int)((ulong)((long)pUVar18 - (long)local_b0->source) >> 1) + -1;
        offsets = offsets + 1;
      }
      goto LAB_0030cc09;
    }
    iVar9 = -1;
    if (0xffff < uVar23) {
      iVar9 = -2;
    }
    _value = local_a8;
    ucnv_fromUWriteBytes_63
              (cnv,buffer,iVar24,(char **)&value,local_90,&offsets,
               (int)((ulong)((long)pUVar18 - (long)local_b0->source) >> 1) + iVar9,local_b8);
    pcVar20 = _value;
    pvVar21 = local_88;
    if (U_ZERO_ERROR < *err) {
LAB_0030d616:
      _value = pcVar20;
      if (((*err < U_ILLEGAL_ARGUMENT_ERROR) &&
          (((*(char *)((long)pvVar21 + 0x66) != '\0' || (*(char *)((long)pvVar21 + 0x62) != '\0'))
           && (local_b0->flush != '\0')))) && ((local_78 <= pUVar18 && (cnv->fromUChar32 == 0)))) {
        bVar26 = *(char *)((long)pvVar21 + 0x66) != '\0';
        if (bVar26) {
          buffer[0] = '\x0f';
          *(undefined1 *)((long)pvVar21 + 0x66) = 0;
        }
        uVar23 = (uint)bVar26;
        if (*(char *)((long)pvVar21 + 0x62) != '\0') {
          buffer[(ulong)bVar26 + 2] = 'B';
          (buffer + bVar26)[0] = '\x1b';
          (buffer + bVar26)[1] = '(';
          uVar23 = uVar23 + 3;
          *(undefined1 *)((long)pvVar21 + 0x62) = 0;
        }
        pUVar4 = local_b0->source;
        iVar24 = (int)((ulong)((long)pUVar18 - (long)pUVar4) >> 1);
        if (iVar24 < 1) {
          uVar7 = 0xffffffff;
        }
        else {
          uVar7 = iVar24 - 1;
          if (((pUVar4[uVar7] & 0xfc00U) == 0xdc00) &&
             ((uVar7 == 0 || ((pUVar4[iVar24 - 2] & 0xfc00U) == 0xd800)))) {
            uVar7 = iVar24 - 2;
          }
        }
        ucnv_fromUWriteBytes_63(cnv,buffer,uVar23,(char **)&value,local_90,&offsets,uVar7,err);
      }
      local_b0->source = pUVar18;
      local_b0->target = _value;
      return;
    }
  } while( true );
}

Assistant:

static void U_CALLCONV
UConverter_fromUnicode_ISO_2022_JP_OFFSETS_LOGIC(UConverterFromUnicodeArgs* args, UErrorCode* err) {
    UConverter *cnv = args->converter;
    UConverterDataISO2022 *converterData;
    ISO2022State *pFromU2022State;
    uint8_t *target = (uint8_t *) args->target;
    const uint8_t *targetLimit = (const uint8_t *) args->targetLimit;
    const UChar* source = args->source;
    const UChar* sourceLimit = args->sourceLimit;
    int32_t* offsets = args->offsets;
    UChar32 sourceChar;
    char buffer[8];
    int32_t len, outLen;
    int8_t choices[10];
    int32_t choiceCount;
    uint32_t targetValue = 0;
    UBool useFallback;

    int32_t i;
    int8_t cs, g;

    /* set up the state */
    converterData     = (UConverterDataISO2022*)cnv->extraInfo;
    pFromU2022State   = &converterData->fromU2022State;

    choiceCount = 0;

    /* check if the last codepoint of previous buffer was a lead surrogate*/
    if((sourceChar = cnv->fromUChar32)!=0 && target< targetLimit) {
        goto getTrail;
    }

    while(source < sourceLimit) {
        if(target < targetLimit) {

            sourceChar  = *(source++);
            /*check if the char is a First surrogate*/
            if(U16_IS_SURROGATE(sourceChar)) {
                if(U16_IS_SURROGATE_LEAD(sourceChar)) {
getTrail:
                    /*look ahead to find the trail surrogate*/
                    if(source < sourceLimit) {
                        /* test the following code unit */
                        UChar trail=(UChar) *source;
                        if(U16_IS_TRAIL(trail)) {
                            source++;
                            sourceChar=U16_GET_SUPPLEMENTARY(sourceChar, trail);
                            cnv->fromUChar32=0x00;
                            /* convert this supplementary code point */
                            /* exit this condition tree */
                        } else {
                            /* this is an unmatched lead code unit (1st surrogate) */
                            /* callback(illegal) */
                            *err=U_ILLEGAL_CHAR_FOUND;
                            cnv->fromUChar32=sourceChar;
                            break;
                        }
                    } else {
                        /* no more input */
                        cnv->fromUChar32=sourceChar;
                        break;
                    }
                } else {
                    /* this is an unmatched trail code unit (2nd surrogate) */
                    /* callback(illegal) */
                    *err=U_ILLEGAL_CHAR_FOUND;
                    cnv->fromUChar32=sourceChar;
                    break;
                }
            }

            /* do not convert SO/SI/ESC */
            if(IS_2022_CONTROL(sourceChar)) {
                /* callback(illegal) */
                *err=U_ILLEGAL_CHAR_FOUND;
                cnv->fromUChar32=sourceChar;
                break;
            }

            /* do the conversion */

            if(choiceCount == 0) {
                uint16_t csm;

                /*
                 * The csm variable keeps track of which charsets are allowed
                 * and not used yet while building the choices[].
                 */
                csm = jpCharsetMasks[converterData->version];
                choiceCount = 0;

                /* JIS7/8: try single-byte half-width Katakana before JISX208 */
                if(converterData->version == 3 || converterData->version == 4) {
                    choices[choiceCount++] = (int8_t)HWKANA_7BIT;
                }
                /* Do not try single-byte half-width Katakana for other versions. */
                csm &= ~CSM(HWKANA_7BIT);

                /* try the current G0 charset */
                choices[choiceCount++] = cs = pFromU2022State->cs[0];
                csm &= ~CSM(cs);

                /* try the current G2 charset */
                if((cs = pFromU2022State->cs[2]) != 0) {
                    choices[choiceCount++] = cs;
                    csm &= ~CSM(cs);
                }

                /* try all the other possible charsets */
                for(i = 0; i < UPRV_LENGTHOF(jpCharsetPref); ++i) {
                    cs = (int8_t)jpCharsetPref[i];
                    if(CSM(cs) & csm) {
                        choices[choiceCount++] = cs;
                        csm &= ~CSM(cs);
                    }
                }
            }

            cs = g = 0;
            /*
             * len==0: no mapping found yet
             * len<0: found a fallback result: continue looking for a roundtrip but no further fallbacks
             * len>0: found a roundtrip result, done
             */
            len = 0;
            /*
             * We will turn off useFallback after finding a fallback,
             * but we still get fallbacks from PUA code points as usual.
             * Therefore, we will also need to check that we don't overwrite
             * an early fallback with a later one.
             */
            useFallback = cnv->useFallback;

            for(i = 0; i < choiceCount && len <= 0; ++i) {
                uint32_t value;
                int32_t len2;
                int8_t cs0 = choices[i];
                switch(cs0) {
                case ASCII:
                    if(sourceChar <= 0x7f) {
                        targetValue = (uint32_t)sourceChar;
                        len = 1;
                        cs = cs0;
                        g = 0;
                    }
                    break;
                case ISO8859_1:
                    if(GR96_START <= sourceChar && sourceChar <= GR96_END) {
                        targetValue = (uint32_t)sourceChar - 0x80;
                        len = 1;
                        cs = cs0;
                        g = 2;
                    }
                    break;
                case HWKANA_7BIT:
                    if((uint32_t)(sourceChar - HWKANA_START) <= (HWKANA_END - HWKANA_START)) {
                        if(converterData->version==3) {
                            /* JIS7: use G1 (SO) */
                            /* Shift U+FF61..U+FF9F to bytes 21..5F. */
                            targetValue = (uint32_t)(sourceChar - (HWKANA_START - 0x21));
                            len = 1;
                            pFromU2022State->cs[1] = cs = cs0; /* do not output an escape sequence */
                            g = 1;
                        } else if(converterData->version==4) {
                            /* JIS8: use 8-bit bytes with any single-byte charset, see escape sequence output below */
                            /* Shift U+FF61..U+FF9F to bytes A1..DF. */
                            targetValue = (uint32_t)(sourceChar - (HWKANA_START - 0xa1));
                            len = 1;

                            cs = pFromU2022State->cs[0];
                            if(IS_JP_DBCS(cs)) {
                                /* switch from a DBCS charset to JISX201 */
                                cs = (int8_t)JISX201;
                            }
                            /* else stay in the current G0 charset */
                            g = 0;
                        }
                        /* else do not use HWKANA_7BIT with other versions */
                    }
                    break;
                case JISX201:
                    /* G0 SBCS */
                    value = jisx201FromU(sourceChar);
                    if(value <= 0x7f) {
                        targetValue = value;
                        len = 1;
                        cs = cs0;
                        g = 0;
                        useFallback = FALSE;
                    }
                    break;
                case JISX208:
                    /* G0 DBCS from Shift-JIS table */
                    len2 = MBCS_FROM_UCHAR32_ISO2022(
                                converterData->myConverterArray[cs0],
                                sourceChar, &value,
                                useFallback, MBCS_OUTPUT_2);
                    if(len2 == 2 || (len2 == -2 && len == 0)) {  /* only accept DBCS: abs(len)==2 */
                        value = _2022FromSJIS(value);
                        if(value != 0) {
                            targetValue = value;
                            len = len2;
                            cs = cs0;
                            g = 0;
                            useFallback = FALSE;
                        }
                    } else if(len == 0 && useFallback &&
                              (uint32_t)(sourceChar - HWKANA_START) <= (HWKANA_END - HWKANA_START)) {
                        targetValue = hwkana_fb[sourceChar - HWKANA_START];
                        len = -2;
                        cs = cs0;
                        g = 0;
                        useFallback = FALSE;
                    }
                    break;
                case ISO8859_7:
                    /* G0 SBCS forced to 7-bit output */
                    len2 = MBCS_SINGLE_FROM_UCHAR32(
                                converterData->myConverterArray[cs0],
                                sourceChar, &value,
                                useFallback);
                    if(len2 != 0 && !(len2 < 0 && len != 0) && GR96_START <= value && value <= GR96_END) {
                        targetValue = value - 0x80;
                        len = len2;
                        cs = cs0;
                        g = 2;
                        useFallback = FALSE;
                    }
                    break;
                default:
                    /* G0 DBCS */
                    len2 = MBCS_FROM_UCHAR32_ISO2022(
                                converterData->myConverterArray[cs0],
                                sourceChar, &value,
                                useFallback, MBCS_OUTPUT_2);
                    if(len2 == 2 || (len2 == -2 && len == 0)) {  /* only accept DBCS: abs(len)==2 */
                        if(cs0 == KSC5601) {
                            /*
                             * Check for valid bytes for the encoding scheme.
                             * This is necessary because the sub-converter (windows-949)
                             * has a broader encoding scheme than is valid for 2022.
                             */
                            value = _2022FromGR94DBCS(value);
                            if(value == 0) {
                                break;
                            }
                        }
                        targetValue = value;
                        len = len2;
                        cs = cs0;
                        g = 0;
                        useFallback = FALSE;
                    }
                    break;
                }
            }

            if(len != 0) {
                if(len < 0) {
                    len = -len;  /* fallback */
                }
                outLen = 0; /* count output bytes */

                /* write SI if necessary (only for JIS7) */
                if(pFromU2022State->g == 1 && g == 0) {
                    buffer[outLen++] = UCNV_SI;
                    pFromU2022State->g = 0;
                }

                /* write the designation sequence if necessary */
                if(cs != pFromU2022State->cs[g]) {
                    int32_t escLen = escSeqCharsLen[cs];
                    uprv_memcpy(buffer + outLen, escSeqChars[cs], escLen);
                    outLen += escLen;
                    pFromU2022State->cs[g] = cs;

                    /* invalidate the choices[] */
                    choiceCount = 0;
                }

                /* write the shift sequence if necessary */
                if(g != pFromU2022State->g) {
                    switch(g) {
                    /* case 0 handled before writing escapes */
                    case 1:
                        buffer[outLen++] = UCNV_SO;
                        pFromU2022State->g = 1;
                        break;
                    default: /* case 2 */
                        buffer[outLen++] = 0x1b;
                        buffer[outLen++] = 0x4e;
                        break;
                    /* no case 3: no SS3 in ISO-2022-JP-x */
                    }
                }

                /* write the output bytes */
                if(len == 1) {
                    buffer[outLen++] = (char)targetValue;
                } else /* len == 2 */ {
                    buffer[outLen++] = (char)(targetValue >> 8);
                    buffer[outLen++] = (char)targetValue;
                }
            } else {
                /*
                 * if we cannot find the character after checking all codepages
                 * then this is an error
                 */
                *err = U_INVALID_CHAR_FOUND;
                cnv->fromUChar32=sourceChar;
                break;
            }

            if(sourceChar == CR || sourceChar == LF) {
                /* reset the G2 state at the end of a line (conversion got us into ASCII or JISX201 already) */
                pFromU2022State->cs[2] = 0;
                choiceCount = 0;
            }

            /* output outLen>0 bytes in buffer[] */
            if(outLen == 1) {
                *target++ = buffer[0];
                if(offsets) {
                    *offsets++ = (int32_t)(source - args->source - 1); /* -1: known to be ASCII */
                }
            } else if(outLen == 2 && (target + 2) <= targetLimit) {
                *target++ = buffer[0];
                *target++ = buffer[1];
                if(offsets) {
                    int32_t sourceIndex = (int32_t)(source - args->source - U16_LENGTH(sourceChar));
                    *offsets++ = sourceIndex;
                    *offsets++ = sourceIndex;
                }
            } else {
                fromUWriteUInt8(
                    cnv,
                    buffer, outLen,
                    &target, (const char *)targetLimit,
                    &offsets, (int32_t)(source - args->source - U16_LENGTH(sourceChar)),
                    err);
                if(U_FAILURE(*err)) {
                    break;
                }
            }
        } /* end if(myTargetIndex<myTargetLength) */
        else{
            *err =U_BUFFER_OVERFLOW_ERROR;
            break;
        }

    }/* end while(mySourceIndex<mySourceLength) */

    /*
     * the end of the input stream and detection of truncated input
     * are handled by the framework, but for ISO-2022-JP conversion
     * we need to be in ASCII mode at the very end
     *
     * conditions:
     *   successful
     *   in SO mode or not in ASCII mode
     *   end of input and no truncated input
     */
    if( U_SUCCESS(*err) &&
        (pFromU2022State->g!=0 || pFromU2022State->cs[0]!=ASCII) &&
        args->flush && source>=sourceLimit && cnv->fromUChar32==0
    ) {
        int32_t sourceIndex;

        outLen = 0;

        if(pFromU2022State->g != 0) {
            buffer[outLen++] = UCNV_SI;
            pFromU2022State->g = 0;
        }

        if(pFromU2022State->cs[0] != ASCII) {
            int32_t escLen = escSeqCharsLen[ASCII];
            uprv_memcpy(buffer + outLen, escSeqChars[ASCII], escLen);
            outLen += escLen;
            pFromU2022State->cs[0] = (int8_t)ASCII;
        }

        /* get the source index of the last input character */
        /*
         * TODO this would be simpler and more reliable if we used a pair
         * of sourceIndex/prevSourceIndex like in ucnvmbcs.c
         * so that we could simply use the prevSourceIndex here;
         * this code gives an incorrect result for the rare case of an unmatched
         * trail surrogate that is alone in the last buffer of the text stream
         */
        sourceIndex=(int32_t)(source-args->source);
        if(sourceIndex>0) {
            --sourceIndex;
            if( U16_IS_TRAIL(args->source[sourceIndex]) &&
                (sourceIndex==0 || U16_IS_LEAD(args->source[sourceIndex-1]))
            ) {
                --sourceIndex;
            }
        } else {
            sourceIndex=-1;
        }

        fromUWriteUInt8(
            cnv,
            buffer, outLen,
            &target, (const char *)targetLimit,
            &offsets, sourceIndex,
            err);
    }

    /*save the state and return */
    args->source = source;
    args->target = (char*)target;
}